

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86.cpp
# Opt level: O1

int __thiscall ncnn::Mish_x86::forward_inplace(Mish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  undefined1 (*pauVar10) [16];
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar9 = 0;
    do {
      pauVar10 = (undefined1 (*) [16])
                 (bottom_top_blob->cstep * lVar9 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar8 < 4) {
        uVar7 = 0;
      }
      else {
        iVar6 = 3;
        do {
          auVar1 = *pauVar10;
          auVar12._8_4_ = 0x42b0c0a5;
          auVar12._0_8_ = 0x42b0c0a542b0c0a5;
          auVar12._12_4_ = 0x42b0c0a5;
          auVar12 = minps(auVar1,auVar12);
          auVar4._8_4_ = 0xc2b0c0a5;
          auVar4._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar4._12_4_ = 0xc2b0c0a5;
          auVar12 = maxps(auVar12,auVar4);
          fVar14 = auVar12._0_4_ * 1.442695 + 0.5;
          fVar18 = auVar12._4_4_ * 1.442695 + 0.5;
          fVar19 = auVar12._8_4_ * 1.442695 + 0.5;
          fVar20 = auVar12._12_4_ * 1.442695 + 0.5;
          fVar21 = (float)(int)fVar14;
          fVar22 = (float)(int)fVar18;
          fVar23 = (float)(int)fVar19;
          fVar24 = (float)(int)fVar20;
          fVar21 = fVar21 - (float)(-(uint)(fVar14 < fVar21) & 0x3f800000);
          fVar22 = fVar22 - (float)(-(uint)(fVar18 < fVar22) & 0x3f800000);
          fVar23 = fVar23 - (float)(-(uint)(fVar19 < fVar23) & 0x3f800000);
          fVar24 = fVar24 - (float)(-(uint)(fVar20 < fVar24) & 0x3f800000);
          fVar14 = auVar12._0_4_ - fVar21 * 0.6931472;
          fVar18 = auVar12._4_4_ - fVar22 * 0.6931472;
          fVar19 = auVar12._8_4_ - fVar23 * 0.6931472;
          fVar20 = auVar12._12_4_ - fVar24 * 0.6931472;
          auVar15._0_4_ =
               (float)((int)fVar21 * 0x800000 + 0x3f800000) *
               (fVar14 + 1.0 +
               (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) * fVar14 +
                 0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5) * fVar14 * fVar14) + 1.0;
          auVar15._4_4_ =
               (float)((int)fVar22 * 0x800000 + 0x3f800000) *
               (fVar18 + 1.0 +
               (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
                 0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5) * fVar18 * fVar18) + 1.0;
          auVar15._8_4_ =
               (float)((int)fVar23 * 0x800000 + 0x3f800000) *
               (fVar19 + 1.0 +
               (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
                 0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5) * fVar19 * fVar19) + 1.0;
          auVar15._12_4_ =
               (float)((int)fVar24 * 0x800000 + 0x3f800000) *
               (fVar20 + 1.0 +
               (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
                 0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5) * fVar20 * fVar20) + 1.0;
          auVar12 = maxps(auVar15,_DAT_005f1a10);
          fVar14 = (float)(auVar12._0_4_ & 0x807fffff | 0x3f000000);
          fVar19 = (float)(auVar12._4_4_ & 0x807fffff | 0x3f000000);
          fVar21 = (float)(auVar12._8_4_ & 0x807fffff | 0x3f000000);
          fVar23 = (float)(auVar12._12_4_ & 0x807fffff | 0x3f000000);
          fVar18 = fVar14 + -1.0 + (float)(-(uint)(fVar14 < 0.70710677) & (uint)fVar14);
          fVar20 = fVar19 + -1.0 + (float)(-(uint)(fVar19 < 0.70710677) & (uint)fVar19);
          fVar22 = fVar21 + -1.0 + (float)(-(uint)(fVar21 < 0.70710677) & (uint)fVar21);
          fVar24 = fVar23 + -1.0 + (float)(-(uint)(fVar23 < 0.70710677) & (uint)fVar23);
          auVar16._0_4_ =
               ~-(uint)(auVar15._0_4_ <= 0.0) &
               (uint)((((float)(int)((auVar12._0_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar14 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar18 +
                      (((((((((fVar18 * 0.070376836 + -0.1151461) * fVar18 + 0.116769984) * fVar18 +
                            -0.12420141) * fVar18 + 0.14249323) * fVar18 + -0.16668057) * fVar18 +
                         0.20000714) * fVar18 + -0.24999994) * fVar18 + 0.3333333) * fVar18 + -0.5)
                      * fVar18 * fVar18) * -2.0);
          auVar16._4_4_ =
               ~-(uint)(auVar15._4_4_ <= 0.0) &
               (uint)((((float)(int)((auVar12._4_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar19 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar20 +
                      (((((((((fVar20 * 0.070376836 + -0.1151461) * fVar20 + 0.116769984) * fVar20 +
                            -0.12420141) * fVar20 + 0.14249323) * fVar20 + -0.16668057) * fVar20 +
                         0.20000714) * fVar20 + -0.24999994) * fVar20 + 0.3333333) * fVar20 + -0.5)
                      * fVar20 * fVar20) * -2.0);
          auVar16._8_4_ =
               ~-(uint)(auVar15._8_4_ <= 0.0) &
               (uint)((((float)(int)((auVar12._8_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar21 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar22 +
                      (((((((((fVar22 * 0.070376836 + -0.1151461) * fVar22 + 0.116769984) * fVar22 +
                            -0.12420141) * fVar22 + 0.14249323) * fVar22 + -0.16668057) * fVar22 +
                         0.20000714) * fVar22 + -0.24999994) * fVar22 + 0.3333333) * fVar22 + -0.5)
                      * fVar22 * fVar22) * -2.0);
          auVar16._12_4_ =
               ~-(uint)(auVar15._12_4_ <= 0.0) &
               (uint)((((float)(int)((auVar12._12_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar23 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar24 +
                      (((((((((fVar24 * 0.070376836 + -0.1151461) * fVar24 + 0.116769984) * fVar24 +
                            -0.12420141) * fVar24 + 0.14249323) * fVar24 + -0.16668057) * fVar24 +
                         0.20000714) * fVar24 + -0.24999994) * fVar24 + 0.3333333) * fVar24 + -0.5)
                      * fVar24 * fVar24) * -2.0);
          auVar13._0_8_ =
               CONCAT44(-(uint)(auVar15._4_4_ <= 0.0),-(uint)(auVar15._0_4_ <= 0.0)) &
               0x7fffffff7fffffff;
          auVar13._8_4_ = -(uint)(auVar15._8_4_ <= 0.0) & 0x7fffffff;
          auVar13._12_4_ = -(uint)(auVar15._12_4_ <= 0.0) & 0x7fffffff;
          auVar3._8_4_ = 0x42b0c0a5;
          auVar3._0_8_ = 0x42b0c0a542b0c0a5;
          auVar3._12_4_ = 0x42b0c0a5;
          auVar12 = minps(auVar13 | auVar16,auVar3);
          auVar5._8_4_ = 0xc2b0c0a5;
          auVar5._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar5._12_4_ = 0xc2b0c0a5;
          auVar12 = maxps(auVar12,auVar5);
          fVar14 = auVar12._0_4_ * 1.442695 + 0.5;
          fVar18 = auVar12._4_4_ * 1.442695 + 0.5;
          fVar19 = auVar12._8_4_ * 1.442695 + 0.5;
          fVar20 = auVar12._12_4_ * 1.442695 + 0.5;
          fVar21 = (float)(int)fVar14;
          fVar22 = (float)(int)fVar18;
          fVar23 = (float)(int)fVar19;
          fVar24 = (float)(int)fVar20;
          fVar21 = fVar21 - (float)(-(uint)(fVar14 < fVar21) & 0x3f800000);
          fVar22 = fVar22 - (float)(-(uint)(fVar18 < fVar22) & 0x3f800000);
          fVar23 = fVar23 - (float)(-(uint)(fVar19 < fVar23) & 0x3f800000);
          fVar24 = fVar24 - (float)(-(uint)(fVar20 < fVar24) & 0x3f800000);
          fVar14 = auVar12._0_4_ - fVar21 * 0.6931472;
          fVar18 = auVar12._4_4_ - fVar22 * 0.6931472;
          fVar19 = auVar12._8_4_ - fVar23 * 0.6931472;
          fVar20 = auVar12._12_4_ - fVar24 * 0.6931472;
          auVar17._0_4_ =
               (float)((int)fVar21 * 0x800000 + 0x3f800000) *
               (fVar14 + 1.0 +
               (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) * fVar14 +
                 0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5) * fVar14 * fVar14) + 1.0;
          auVar17._4_4_ =
               (float)((int)fVar22 * 0x800000 + 0x3f800000) *
               (fVar18 + 1.0 +
               (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
                 0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5) * fVar18 * fVar18) + 1.0;
          auVar17._8_4_ =
               (float)((int)fVar23 * 0x800000 + 0x3f800000) *
               (fVar19 + 1.0 +
               (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
                 0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5) * fVar19 * fVar19) + 1.0;
          auVar17._12_4_ =
               (float)((int)fVar24 * 0x800000 + 0x3f800000) *
               (fVar20 + 1.0 +
               (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
                 0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5) * fVar20 * fVar20) + 1.0;
          auVar12 = divps(_DAT_005f2620,auVar17);
          *(float *)*pauVar10 = (auVar12._0_4_ + -1.0) * auVar1._0_4_;
          *(float *)(*pauVar10 + 4) = (auVar12._4_4_ + -1.0) * auVar1._4_4_;
          *(float *)(*pauVar10 + 8) = (auVar12._8_4_ + -1.0) * auVar1._8_4_;
          *(float *)(*pauVar10 + 0xc) = (auVar12._12_4_ + -1.0) * auVar1._12_4_;
          pauVar10 = pauVar10 + 1;
          iVar6 = iVar6 + 4;
          uVar7 = uVar8 & 0xfffffffc;
        } while (iVar6 < (int)uVar8);
      }
      if (uVar8 - uVar7 != 0 && (int)uVar7 <= (int)uVar8) {
        lVar11 = 0;
        do {
          fVar14 = *(float *)(*pauVar10 + lVar11 * 4);
          fVar18 = expf(fVar14);
          fVar18 = logf(fVar18 + 1.0);
          fVar18 = tanhf(fVar18);
          *(float *)(*pauVar10 + lVar11 * 4) = fVar18 * fVar14;
          lVar11 = lVar11 + 1;
        } while (uVar8 - uVar7 != (int)lVar11);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar2);
  }
  return 0;
}

Assistant:

int Mish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = mish_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}